

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcPointOnCurve::IfcPointOnCurve(IfcPointOnCurve *this)

{
  IfcPointOnCurve *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x50,"IfcPointOnCurve");
  IfcPoint::IfcPoint(&this->super_IfcPoint,&PTR_construction_vtable_24__00ff8078);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPointOnCurve,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcPointOnCurve,_2UL> *)
             &(this->super_IfcPoint).super_IfcGeometricRepresentationItem.field_0x30,
             &PTR_construction_vtable_24__00ff80f0);
  (this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xff7fc0;
  *(undefined8 *)&this->field_0x50 = 0xff8060;
  *(undefined8 *)
   &(this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xff7fe8;
  *(undefined8 *)
   &(this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xff8010;
  *(undefined8 *)&(this->super_IfcPoint).super_IfcGeometricRepresentationItem.field_0x30 = 0xff8038;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcCurve> *)&(this->super_IfcPoint).field_0x40,
             (LazyObject *)0x0);
  return;
}

Assistant:

IfcPointOnCurve() : Object("IfcPointOnCurve") {}